

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputGetVector(HelicsInput inp,double *data,int maxlen,int *actualSize,HelicsError *err)

{
  int iVar1;
  InputObject *pIVar2;
  
  pIVar2 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (actualSize != (int *)0x0) {
    *actualSize = 0;
  }
  if (pIVar2 != (InputObject *)0x0) {
    if (data == (double *)0x0 || maxlen < 1) {
      helics::Input::clearUpdate(pIVar2->inputPtr);
      return;
    }
    iVar1 = helics::Input::getValue(pIVar2->inputPtr,data,maxlen);
    if (actualSize != (int *)0x0) {
      *actualSize = iVar1;
    }
  }
  return;
}

Assistant:

void helicsInputGetVector(HelicsInput inp, double data[], int maxlen, int* actualSize, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (actualSize != nullptr) {
        *actualSize = 0;
    }
    if (inpObj == nullptr) {
        return;
    }
    if ((data == nullptr) || (maxlen <= 0)) {
        inpObj->inputPtr->clearUpdate();
        // this isn't an error, just no data retrieved
        return;
    }
    try {
        const int length = inpObj->inputPtr->getValue(data, maxlen);
        if (actualSize != nullptr) {
            *actualSize = length;
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}